

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

uint __thiscall ON_SubDEdge::MarkedVertexCount(ON_SubDEdge *this)

{
  bool bVar1;
  uint uVar2;
  uint evi;
  long lVar3;
  
  lVar3 = 0;
  uVar2 = 0;
  do {
    if (this->m_vertex[lVar3] != (ON_SubDVertex *)0x0) {
      bVar1 = ON_ComponentStatus::RuntimeMark
                        (&(this->m_vertex[lVar3]->super_ON_SubDComponentBase).m_status);
      uVar2 = uVar2 + bVar1;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  return uVar2;
}

Assistant:

unsigned int ON_SubDEdge::MarkedVertexCount() const
{
  unsigned int mark_count = 0;
  for (unsigned evi = 0; evi < 2; ++evi)
  {
    const ON_SubDVertex* v = m_vertex[evi];
    if (nullptr != v && v->m_status.RuntimeMark())
      ++mark_count;
  }
  return mark_count;
}